

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestResolveWithLastItem(void)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiContext_conflict *g;
  
  pIVar1 = GImGui;
  GImGui->NavMoveScoringItems = false;
  NavApplyItemToResult(&pIVar1->NavMoveResultLocal);
  NavUpdateAnyRequestFlag();
  return;
}

Assistant:

void ImGui::NavMoveRequestResolveWithLastItem()
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false; // Ensure request doesn't need more processing
    NavApplyItemToResult(&g.NavMoveResultLocal);
    NavUpdateAnyRequestFlag();
}